

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool tinyusdz::operator==(Path *lhs,Path *rhs)

{
  bool bVar1;
  string local_60;
  string local_40;
  Path *local_20;
  Path *rhs_local;
  Path *lhs_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  bVar1 = Path::is_valid(lhs);
  if (bVar1) {
    bVar1 = Path::is_valid(local_20);
    if (bVar1) {
      Path::full_path_name_abi_cxx11_(&local_40,rhs_local);
      Path::full_path_name_abi_cxx11_(&local_60,local_20);
      lhs_local._7_1_ = std::operator==(&local_40,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      lhs_local._7_1_ = 0;
    }
  }
  else {
    lhs_local._7_1_ = 0;
  }
  return (bool)(lhs_local._7_1_ & 1);
}

Assistant:

bool operator==(const Path &lhs, const Path &rhs) {
  if (!lhs.is_valid()) {
    return false;
  }

  if (!rhs.is_valid()) {
    return false;
  }

  // Currently simply compare string.
  // FIXME: Better Path identity check.
  return (lhs.full_path_name() == rhs.full_path_name());
}